

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_allocator.hpp
# Opt level: O0

void __thiscall
Al::internal::
CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
::clear(CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
        *this)

{
  bool bVar1;
  vector<void_*,_std::allocator<void_*>_> *pvVar2;
  HostMemoryAllocator *in_RDI;
  void **ptr;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  size_t bin;
  lock_guard<std::mutex> lg;
  mutex_type *in_stack_ffffffffffffffa8;
  vector<void_*,_std::allocator<void_*>_> *this_00;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_28;
  reference local_20;
  vector<void_*,_std::allocator<void_*>_> *local_18;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffa8);
  local_18 = (vector<void_*,_std::allocator<void_*>_> *)0x0;
  while( true ) {
    this_00 = local_18;
    pvVar2 = (vector<void_*,_std::allocator<void_*>_> *)
             std::array<unsigned_long,_61UL>::size(&bin_sizes);
    if (pvVar2 <= this_00) break;
    local_20 = std::
               vector<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
               ::operator[]((vector<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
                             *)in_RDI,(size_type)local_18);
    local_28._M_current = (void **)std::vector<void_*,_std::allocator<void_*>_>::begin(this_00);
    std::vector<void_*,_std::allocator<void_*>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                          *)in_RDI,
                         (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                          *)this_00);
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
      operator*(&local_28);
      HostMemoryAllocator::deallocate(in_RDI,this_00);
      __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
      operator++(&local_28);
    }
    std::
    vector<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
    ::operator[]((vector<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
                  *)in_RDI,(size_type)local_18);
    std::vector<void_*,_std::allocator<void_*>_>::clear
              ((vector<void_*,_std::allocator<void_*>_> *)0x1322ac);
    local_18 = (vector<void_*,_std::allocator<void_*>_> *)
               ((long)&(local_18->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1322c9);
  return;
}

Assistant:

void clear() {
    std::lock_guard<std::mutex> lg(mutex);
    for (size_t bin = 0; bin < bin_sizes.size(); ++bin) {
      for (auto&& ptr : free_data[bin]) {
        allocator.deallocate(ptr);
      }
      free_data[bin].clear();
    }
  }